

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,*(long *)&(this->super_exception).m + 1);
  std::operator+(&local_78," at line ",&local_38);
  std::operator+(&local_58,&local_78,", column ");
  std::__cxx11::to_string(&sStack_98,*(unsigned_long *)&(this->super_exception).id);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos) {
		return " at line " + std::to_string(pos.lines_read + 1) + ", column " +
			   std::to_string(pos.chars_read_current_line);
	}